

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O2

RatiotestResult ratiotest(Runtime *runtime,QpVector *p,QpVector *rowmove,double alphastart)

{
  double t;
  double dVar1;
  uint uVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pdVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  RatiotestResult RVar14;
  RatiotestResult RVar15;
  double local_90;
  ulong local_88;
  ulong local_80;
  double local_68;
  
  if ((runtime->settings).ratiotest == Textbook) {
    RVar14 = ratiotest_textbook(runtime,p,rowmove,&runtime->instance,alphastart);
    return RVar14;
  }
  RVar14 = ratiotest_textbook(runtime,p,rowmove,&runtime->relaxed_for_ratiotest,alphastart);
  dVar13 = RVar14.alpha;
  local_80 = RVar14._8_8_ >> 0x20;
  iVar6 = RVar14.limitingconstraint;
  if (iVar6 == -1) {
    local_88 = 0xffffffff;
  }
  else {
    uVar2 = (runtime->instance).num_con;
    if (iVar6 < (int)uVar2) {
      pdVar10 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = pdVar10 + iVar6;
    }
    else {
      pdVar7 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (int)(iVar6 - uVar2);
      pdVar10 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    local_68 = *pdVar7;
    pdVar7 = (runtime->rowactivity).value.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (runtime->instance).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (runtime->instance).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    t = (runtime->settings).ratiotest_t;
    for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      dVar1 = pdVar10[uVar11];
      dVar12 = step(pdVar7[uVar11],dVar1,pdVar4[uVar11],pdVar5[uVar11],t);
      if ((ABS(local_68) <= ABS(dVar1)) && (dVar12 <= dVar13)) {
        local_80 = (ulong)(dVar1 < 0.0);
        uVar8 = uVar11 & 0xffffffff;
        RVar14.limitingconstraint = (int)uVar8;
        RVar14.nowactiveatlower = (bool)(char)(uVar8 >> 0x20);
        RVar14._13_3_ = (int3)(uVar8 >> 0x28);
        RVar14.alpha = dVar12;
        local_68 = dVar1;
      }
    }
    uVar3 = (runtime->instance).num_var;
    pdVar7 = (runtime->primal).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar4 = (runtime->instance).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (runtime->instance).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar11;
    }
    for (; local_88 = RVar14._8_8_, local_90 = RVar14.alpha, uVar9 != uVar11; uVar11 = uVar11 + 1) {
      dVar1 = pdVar10[uVar11];
      dVar12 = step(pdVar7[uVar11],dVar1,pdVar4[uVar11],pdVar5[uVar11],t);
      if ((ABS(local_68) <= ABS(dVar1)) && (dVar12 <= dVar13)) {
        local_80 = (ulong)(dVar1 < 0.0);
        RVar14.limitingconstraint = uVar2 + (int)uVar11;
        RVar14.alpha = dVar12;
        RVar14._12_4_ = 0;
        local_68 = dVar1;
      }
    }
    dVar13 = local_90;
    if (local_90 <= 0.0) {
      dVar13 = 0.0;
    }
    local_88 = local_88 & 0xffffffff;
  }
  RVar15._8_8_ = (local_80 & 0xff) << 0x20 | local_88;
  RVar15.alpha = dVar13;
  return RVar15;
}

Assistant:

RatiotestResult ratiotest(Runtime& runtime, const QpVector& p,
                          const QpVector& rowmove, double alphastart) {
  switch (runtime.settings.ratiotest) {
    case RatiotestStrategy::Textbook:
      return ratiotest_textbook(runtime, p, rowmove, runtime.instance,
                                alphastart);
    case RatiotestStrategy::TwoPass:
    default:  // to fix -Wreturn-type warning
      return ratiotest_twopass(runtime, p, rowmove,
                               runtime.relaxed_for_ratiotest, alphastart);
  }
}